

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O2

void DepParserTask::get_eager_action_cost(search *sch,uint32_t idx,uint64_t n)

{
  int *piVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  bool bVar13;
  
  pvVar3 = sch->task_data;
  lVar4 = *(long *)((long)pvVar3 + 0x98);
  lVar5 = *(long *)((long)pvVar3 + 0xa0);
  lVar11 = lVar5 - lVar4;
  if (lVar11 == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (ulong)*(uint *)(lVar5 + -4);
  }
  lVar6 = *(long *)((long)pvVar3 + 0xb8);
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    *(undefined4 *)(*(long *)((long)pvVar3 + 0x38) + 4 + lVar9 * 4) = 0;
  }
  uVar10 = (ulong)idx;
  if (*(long *)((long)pvVar3 + 0x98) != *(long *)((long)pvVar3 + 0xa0)) {
    for (lVar9 = 0; lVar11 >> 2 != lVar9; lVar9 = lVar9 + 1) {
      uVar7 = (ulong)*(uint *)(*(long *)((long)pvVar3 + 0x98) + lVar9 * 4);
      if ((*(uint32_t *)(*(long *)((long)pvVar3 + 0x58) + uVar7 * 4) == idx) &&
         (*(int *)(lVar6 + uVar7 * 4) == 9999999)) {
        piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 8);
        *piVar1 = *piVar1 + 1;
      }
      if ((uVar10 <= n) &&
         (iVar12 = *(int *)(*(long *)((long)pvVar3 + 0x58) + uVar10 * 4),
         iVar12 == *(int *)(*(long *)((long)pvVar3 + 0x98) + lVar9 * 4))) {
        if (iVar12 == 0) {
          iVar12 = 0;
        }
        else {
          piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 4);
          *piVar1 = *piVar1 + 1;
          iVar12 = *(int *)(*(long *)((long)pvVar3 + 0x98) + lVar9 * 4);
        }
        if ((int)uVar8 != iVar12) {
          piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 8);
          *piVar1 = *piVar1 + 1;
        }
      }
    }
  }
  lVar11 = 0;
  for (uVar7 = uVar10; uVar7 <= n + 1; uVar7 = uVar7 + 1) {
    if ((uVar7 <= n) && ((int)uVar8 == *(int *)(*(long *)((long)pvVar3 + 0x58) + uVar7 * 4))) {
      piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 0x10);
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 0xc);
      *piVar1 = *piVar1 + 1;
    }
    bVar13 = lVar11 != 0;
    lVar11 = lVar11 + -1;
    if ((bVar13) && (uVar7 == *(uint *)(*(long *)((long)pvVar3 + 0x58) + uVar8 * 4))) {
      piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 0xc);
      *piVar1 = *piVar1 + 1;
    }
  }
  uVar2 = *(uint *)(*(long *)((long)pvVar3 + 0x58) + uVar10 * 4);
  if ((idx < uVar2) || ((lVar5 != lVar4 && uVar2 == 0 && (**(int **)((long)pvVar3 + 0x98) != 0)))) {
    piVar1 = (int *)(*(long *)((long)pvVar3 + 0x38) + 8);
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

T* get_task_data()
  {
    return (T*)task_data;
  }